

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall Minisat::OnlineProofChecker::cancelUntil(OnlineProofChecker *this)

{
  ulong uVar1;
  
  for (uVar1 = (ulong)(uint)(this->trail).sz; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    (this->assigns).data[(this->trail).data[uVar1 - 1].x >> 1].value = '\x02';
  }
  this->qhead = 0;
  if ((this->trail).data != (Lit *)0x0) {
    (this->trail).sz = 0;
  }
  return;
}

Assistant:

int size(void) const { return sz; }